

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

void __thiscall
cbtDbvt::collideTV(cbtDbvt *this,cbtDbvtNode *root,cbtDbvtVolume *vol,ICollide *policy)

{
  cbtDbvtNode *a;
  bool bVar1;
  cbtAlignedObjectArray<const_cbtDbvtNode_*> stack;
  cbtDbvtNode *root_local;
  cbtDbvtVolume volume;
  char tempmemory [512];
  
  if (root != (cbtDbvtNode *)0x0) {
    volume.mi.m_floats._0_8_ = *(undefined8 *)(vol->mi).m_floats;
    volume.mi.m_floats._8_8_ = *(undefined8 *)((vol->mi).m_floats + 2);
    volume.mx.m_floats._0_8_ = *(undefined8 *)(vol->mx).m_floats;
    volume.mx.m_floats._8_8_ = *(undefined8 *)((vol->mx).m_floats + 2);
    stack.m_ownsMemory = true;
    stack.m_data = (cbtDbvtNode **)0x0;
    stack.m_size = 0;
    stack.m_capacity = 0;
    tempmemory[0] = '\0';
    tempmemory[1] = '\0';
    tempmemory[2] = '\0';
    tempmemory[3] = '\0';
    tempmemory[4] = '\0';
    tempmemory[5] = '\0';
    tempmemory[6] = '\0';
    tempmemory[7] = '\0';
    root_local = root;
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::resize(&stack,0,(cbtDbvtNode **)tempmemory);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::initializeFromBuffer(&stack,tempmemory,0,0x40);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::push_back(&stack,&root_local);
    do {
      a = stack.m_data[(long)stack.m_size + -1];
      stack.m_size = stack.m_size + -1;
      bVar1 = Intersect(&a->volume,&volume);
      if (bVar1) {
        if (*(long *)((long)&a->field_2 + 8) == 0) {
          (*policy->_vptr_ICollide[3])(policy,a);
        }
        else {
          cbtAlignedObjectArray<const_cbtDbvtNode_*>::push_back(&stack,(a->field_2).childs);
          cbtAlignedObjectArray<const_cbtDbvtNode_*>::push_back(&stack,(a->field_2).childs + 1);
        }
      }
    } while (0 < stack.m_size);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray(&stack);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTV(const cbtDbvtNode* root,
							  const cbtDbvtVolume& vol,
							  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
	if (root)
	{
		ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
		volume(vol);
		cbtAlignedObjectArray<const cbtDbvtNode*> stack;
		stack.resize(0);
#ifndef BT_DISABLE_STACK_TEMP_MEMORY
		char tempmemory[SIMPLE_STACKSIZE * sizeof(const cbtDbvtNode*)];
		stack.initializeFromBuffer(tempmemory, 0, SIMPLE_STACKSIZE);
#else
		stack.reserve(SIMPLE_STACKSIZE);
#endif  //BT_DISABLE_STACK_TEMP_MEMORY

		stack.push_back(root);
		do
		{
			const cbtDbvtNode* n = stack[stack.size() - 1];
			stack.pop_back();
			if (Intersect(n->volume, volume))
			{
				if (n->isinternal())
				{
					stack.push_back(n->childs[0]);
					stack.push_back(n->childs[1]);
				}
				else
				{
					policy.Process(n);
				}
			}
		} while (stack.size() > 0);
	}
}